

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_specific_extensions.cpp
# Opt level: O3

void __thiscall
tlm_utils::instance_specific_extension_container::~instance_specific_extension_container
          (instance_specific_extension_container *this)

{
  instance_specific_extensions_per_accessor *piVar1;
  pointer puVar2;
  pointer ppiVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppiVar7;
  
  ppiVar7 = (this->m_ispex_per_accessor).
            super__Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_ispex_per_accessor).
      super__Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppiVar7) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      piVar1 = ppiVar7[uVar5];
      if (piVar1 != (instance_specific_extensions_per_accessor *)0x0) {
        puVar2 = (piVar1->m_extensions).m_entries.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        ppiVar3 = (piVar1->m_extensions).
                  super_vector<tlm_utils::ispex_base_*,_std::allocator<tlm_utils::ispex_base_*>_>.
                  super__Vector_base<tlm_utils::ispex_base_*,_std::allocator<tlm_utils::ispex_base_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppiVar3 != (pointer)0x0) {
          operator_delete(ppiVar3);
        }
      }
      operator_delete(piVar1);
      ppiVar7 = (this->m_ispex_per_accessor).
                super__Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar6 < (ulong)((long)(this->m_ispex_per_accessor).
                                    super__Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppiVar7 >> 3)
      ;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar4);
  }
  if (ppiVar7 != (pointer)0x0) {
    operator_delete(ppiVar7);
    return;
  }
  return;
}

Assistant:

instance_specific_extension_container::
  ~instance_specific_extension_container()
{
  for (unsigned int i=0; i<m_ispex_per_accessor.size(); ++i)
    delete m_ispex_per_accessor[i];
}